

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O0

uint Extra_TruthSemiCanonicize(uint *pInOut,uint *pAux,int nVars,char *pCanonPerm,short *pStore)

{
  char cVar1;
  short sVar2;
  byte bVar3;
  bool bVar4;
  uint *puVar5;
  int iVar6;
  int iVar7;
  uint local_64;
  uint uCanonPhase;
  int nOnes;
  int Counter;
  int fChange;
  int Temp;
  int i;
  int nWords;
  uint *pTemp;
  uint *pOut;
  uint *pIn;
  short *pStore_local;
  char *pCanonPerm_local;
  int nVars_local;
  uint *pAux_local;
  uint *pInOut_local;
  
  iVar6 = Extra_TruthWordNum(nVars);
  local_64 = 0;
  iVar7 = Extra_TruthCountOnes(pInOut,nVars);
  if ((iVar6 * 0x10 < iVar7) || ((iVar7 == iVar6 << 4 && ((*pInOut & 1) != 0)))) {
    local_64 = 1 << ((byte)nVars & 0x1f);
    Extra_TruthNot(pInOut,pInOut,nVars);
  }
  Extra_TruthCountOnesInCofs(pInOut,nVars,pStore);
  for (fChange = 0; fChange < nVars; fChange = fChange + 1) {
    if (pStore[fChange * 2 + 1] < pStore[fChange << 1]) {
      local_64 = 1 << ((byte)fChange & 0x1f) | local_64;
      sVar2 = pStore[fChange << 1];
      pStore[fChange << 1] = pStore[fChange * 2 + 1];
      pStore[fChange * 2 + 1] = sVar2;
      Extra_TruthChangePhase(pInOut,nVars,fChange);
    }
  }
  bVar3 = 0;
  pTemp = pAux;
  pOut = pInOut;
  do {
    bVar4 = false;
    for (fChange = 0; puVar5 = pOut, fChange < nVars + -1; fChange = fChange + 1) {
      if (pStore[(fChange + 1) * 2] < pStore[fChange << 1]) {
        bVar3 = bVar3 + 1;
        bVar4 = true;
        cVar1 = pCanonPerm[fChange];
        pCanonPerm[fChange] = pCanonPerm[fChange + 1];
        pCanonPerm[fChange + 1] = cVar1;
        sVar2 = pStore[fChange << 1];
        pStore[fChange << 1] = pStore[(fChange + 1) * 2];
        pStore[(fChange + 1) * 2] = sVar2;
        sVar2 = pStore[fChange * 2 + 1];
        pStore[fChange * 2 + 1] = pStore[(fChange + 1) * 2 + 1];
        pStore[(fChange + 1) * 2 + 1] = sVar2;
        Extra_TruthSwapAdjacentVars(pTemp,pOut,nVars,fChange);
        pOut = pTemp;
        pTemp = puVar5;
      }
    }
  } while (bVar4);
  if ((bool)(bVar3 & 1)) {
    Extra_TruthCopy(pTemp,pOut,nVars);
  }
  return local_64;
}

Assistant:

unsigned Extra_TruthSemiCanonicize( unsigned * pInOut, unsigned * pAux, int nVars, char * pCanonPerm, short * pStore )
{
    unsigned * pIn = pInOut, * pOut = pAux, * pTemp;
    int nWords = Extra_TruthWordNum( nVars );
    int i, Temp, fChange, Counter, nOnes;//, k, j, w, Limit;
    unsigned uCanonPhase;

    // canonicize output
    uCanonPhase = 0;
    nOnes = Extra_TruthCountOnes(pIn, nVars);
    if ( (nOnes > nWords * 16) || ((nOnes == nWords * 16) && (pIn[0] & 1)) )
    {
        uCanonPhase |= (1 << nVars);
        Extra_TruthNot( pIn, pIn, nVars );
    }

    // collect the minterm counts
    Extra_TruthCountOnesInCofs( pIn, nVars, pStore );

    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[2*i+0] <= pStore[2*i+1] )
            continue;
        uCanonPhase |= (1 << i);
        Temp = pStore[2*i+0];
        pStore[2*i+0] = pStore[2*i+1];
        pStore[2*i+1] = Temp;
        Extra_TruthChangePhase( pIn, nVars, i );
    }

//    Extra_PrintHexadecimal( stdout, pIn, nVars );
//    printf( "\n" );

    // permute
    Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[2*i] <= pStore[2*(i+1)] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            Temp = pStore[2*i];
            pStore[2*i] = pStore[2*(i+1)];
            pStore[2*(i+1)] = Temp;

            Temp = pStore[2*i+1];
            pStore[2*i+1] = pStore[2*(i+1)+1];
            pStore[2*(i+1)+1] = Temp;

            Extra_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );

/*
    Extra_PrintBinary( stdout, &uCanonPhase, nVars+1 ); printf( " : " );
    for ( i = 0; i < nVars; i++ )
        printf( "%d=%d/%d  ", pCanonPerm[i], pStore[2*i], pStore[2*i+1] );
    printf( "  C = %d\n", Counter );
    Extra_PrintHexadecimal( stdout, pIn, nVars );
    printf( "\n" );
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        if ( pStore[2*i] != pStore[2*i+1] )
            continue;
        if ( Extra_TruthVarsSymm( pIn, nVars, i, i+1 ) )
            continue;
        if ( Extra_TruthVarsAntiSymm( pIn, nVars, i, i+1 ) )
            Extra_TruthChangePhase( pIn, nVars, i+1 );
    }
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        // i and i+1 can be symmetric
        // find the end of this group
        for ( k = i+1; k < nVars; k++ )
            if ( pStore[2*i] != pStore[2*k] ) 
                break;
        Limit = k;
        assert( i < Limit-1 );
        // go through the variables in this group
        for ( j = i + 1; j < Limit; j++ )
        {
            // check symmetry
            if ( Extra_TruthVarsSymm( pIn, nVars, i, j ) )
            {
                uSymms |= (1 << j);
                continue;
            }
            // they are phase-unknown
            if ( pStore[2*i] == pStore[2*i+1] ) 
            {
                if ( Extra_TruthVarsAntiSymm( pIn, nVars, i, j ) )
                {
                    Extra_TruthChangePhase( pIn, nVars, j );
                    uCanonPhase ^= (1 << j);
                    uSymms |= (1 << j);
                    continue;
                }
            }

            // they are not symmetric - move j as far as it goes in the group
            for ( k = j; k < Limit-1; k++ )
            {
                Counter++;

                Temp = pCanonPerm[k];
                pCanonPerm[k] = pCanonPerm[k+1];
                pCanonPerm[k+1] = Temp;

                assert( pStore[2*k] == pStore[2*(k+1)] );
                Extra_TruthSwapAdjacentVars( pOut, pIn, nVars, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
            }
            Limit--;
            j--;
        }
        i = Limit - 1;
    }
*/

    // swap if it was moved an even number of times
    if ( Counter & 1 )
        Extra_TruthCopy( pOut, pIn, nVars );
    return uCanonPhase;
}